

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<const_google::protobuf::Message_*>
google::protobuf::json_internal::UnparseProto2Descriptor::GetMessage(Field f)

{
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 extraout_RDX;
  StatusOr<const_google::protobuf::Message_*> SVar1;
  Status SStack_18;
  
  absl::lts_20240722::InternalError(&SStack_18,0x23,"message fields cannot have defaults");
  absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
  StatusOrData<absl::lts_20240722::Status,_0>
            ((StatusOrData<const_google::protobuf::Message_*> *)f,&SStack_18);
  absl::lts_20240722::Status::~Status(&SStack_18);
  SVar1.super_StatusOrData<const_google::protobuf::Message_*>.field_1.data_ = extraout_RDX.data_;
  SVar1.super_StatusOrData<const_google::protobuf::Message_*>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)f;
  return (StatusOr<const_google::protobuf::Message_*>)
         SVar1.super_StatusOrData<const_google::protobuf::Message_*>;
}

Assistant:

static absl::StatusOr<const Msg*> GetMessage(Field f) {
    return absl::InternalError("message fields cannot have defaults");
  }